

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.cpp
# Opt level: O3

size_t __thiscall TilePool::allocateSector(TilePool *this)

{
  bitset<64UL> *pbVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  __uniq_ptr_data<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>,_true,_true> _Var5;
  ulong uVar6;
  iterator __position;
  source_loc loc;
  source_loc loc_00;
  logger *plVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  string_view_t fmt;
  string_view_t fmt_00;
  _Head_base<0UL,_TilePool::PoolItem_*,_false> local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  unsigned_long local_38;
  unsigned_long local_30;
  unsigned_long local_28;
  
  puVar3 = (this->itemsAllocatedCount_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(this->itemsAllocatedCount_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 2;
    puVar4 = (this->items_).
             super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar9 = 0;
    local_30 = 0;
    do {
      uVar2 = puVar3[local_30];
      if (uVar2 < 0x40) {
        _Var5.super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>.
        _M_t.super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>.
        super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl =
             puVar4[local_30]._M_t.
             super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>;
        uVar6 = *(ulong *)((long)_Var5.
                                 super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>
                                 .super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl +
                          0x1030);
        uVar10 = 0;
        do {
          if ((uVar6 >> (uVar10 & 0x3f) & 1) == 0) {
            *(ulong *)((long)_Var5.
                             super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>
                             .super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl +
                      0x1030) = uVar6 | 1L << ((byte)uVar10 & 0x3f);
            puVar3[local_30] = uVar2 + 1;
            local_38 = uVar10 - lVar9;
            local_28 = (long)(this->items_).
                             super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
            plVar7 = spdlog::default_logger_raw();
            local_58._M_head_impl = (PoolItem *)0x0;
            uStack_50 = 0;
            local_48 = 0;
            loc.funcname = (char *)0x0;
            loc.filename = (char *)0x0;
            loc.line = 0;
            loc._12_4_ = 0;
            fmt.size_ = 0x3d;
            fmt.data_ = "TilePool allocating sector {} at index {} (items size is {}).";
            spdlog::logger::log_<unsigned_long,unsigned_long&,unsigned_long>
                      (plVar7,loc,debug,fmt,&local_38,&local_30,&local_28);
            return local_30 * 0x40 + uVar10;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != 0x40);
      }
      local_30 = local_30 + 1;
      lVar9 = lVar9 + -0x40;
    } while (local_30 != lVar8 + (ulong)(lVar8 == 0));
  }
  details::make_unique<TilePool::PoolItem,_0>();
  std::
  vector<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>,std::allocator<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>>
  ::emplace_back<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>
            ((vector<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>,std::allocator<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>>
              *)this,(unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)
                     &local_58);
  if (local_58._M_head_impl != (PoolItem *)0x0) {
    std::default_delete<TilePool::PoolItem>::operator()
              ((default_delete<TilePool::PoolItem> *)&local_58,local_58._M_head_impl);
  }
  pbVar1 = &((this->items_).
             super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>.
             _M_t.
             super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>.
             super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl)->allocated;
  (pbVar1->super__Base_bitset<1UL>)._M_w = (pbVar1->super__Base_bitset<1UL>)._M_w | 1;
  local_58._M_head_impl._0_4_ = 1;
  __position._M_current =
       (this->itemsAllocatedCount_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->itemsAllocatedCount_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->itemsAllocatedCount_,__position,(uint *)&local_58);
  }
  else {
    *__position._M_current = 1;
    (this->itemsAllocatedCount_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  lVar8 = (long)(this->items_).
                super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->items_).
                super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_30 = lVar8 * 8 - 0x40;
  local_38 = lVar8 >> 3;
  plVar7 = spdlog::default_logger_raw();
  local_58._M_head_impl = (PoolItem *)0x0;
  uStack_50 = 0;
  local_48 = 0;
  loc_00.funcname = (char *)0x0;
  loc_00.filename = (char *)0x0;
  loc_00.line = 0;
  loc_00._12_4_ = 0;
  fmt_00.size_ = 0x38;
  fmt_00.data_ = "TilePool allocating sector {} at end (items size is {}).";
  spdlog::logger::log_<unsigned_long,unsigned_long>(plVar7,loc_00,debug,fmt_00,&local_30,&local_38);
  return ((long)(this->items_).
                super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->items_).
               super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) * 8 - 0x40;
}

Assistant:

size_t TilePool::allocateSector() {
    /*++upperId_;
    const auto itemIndex = static_cast<size_t>((upperId_ - baseId_) / CHUNK_AREA);
    if (itemIndex == items_.size()) {
        items_.emplace_back(details::make_unique<PoolItem>());
    }
    //spdlog::debug("TilePool allocating id {} at index {} (items size is {}).", upperId_, itemIndex, items_.size());

    PoolItem* item = items_[itemIndex].get();
    item->allocated.set(upperId_ % CHUNK_AREA);
    ++item->allocatedCount;
    return {
        item->chunk.accessTile(upperId_ % CHUNK_AREA),
        upperId_
    };*/

    for (size_t i = 0; i < itemsAllocatedCount_.size(); ++i) {
        if (itemsAllocatedCount_[i] < SECTORS_PER_CHUNK) {
            for (int j = 0; j < SECTORS_PER_CHUNK; ++j) {
                if (!items_[i]->allocated.test(j)) {
                    items_[i]->allocated.set(j);
                    ++itemsAllocatedCount_[i];
                    spdlog::debug("TilePool allocating sector {} at index {} (items size is {}).", i * SECTORS_PER_CHUNK + j, i, items_.size());
                    return i * SECTORS_PER_CHUNK + j;
                }
            }
        }
    }
    items_.emplace_back(details::make_unique<PoolItem>());
    items_.back()->allocated.set(0);
    itemsAllocatedCount_.push_back(1);
    spdlog::debug("TilePool allocating sector {} at end (items size is {}).", (items_.size() - 1) * SECTORS_PER_CHUNK, items_.size());
    return (items_.size() - 1) * SECTORS_PER_CHUNK;
}